

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::InitializeElementMatrix
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this,TPZElementMatrix *ef)

{
  long lVar1;
  uint num_of_blocks;
  int iVar2;
  int iVar3;
  TPZCompMesh *pTVar4;
  TPZConnect *pTVar5;
  long *plVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  _List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> local_48;
  
  num_of_blocks =
       (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))();
  pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
  ef->fMesh = pTVar4;
  ef->fType = EF;
  uVar10 = 0;
  uVar7 = 0;
  if (0 < (int)num_of_blocks) {
    uVar7 = num_of_blocks;
  }
  iVar9 = 0;
  for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    pTVar5 = (TPZConnect *)
             (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa8))
                       (this,uVar10);
    pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
    iVar2 = TPZConnect::NDof(pTVar5,pTVar4);
    iVar9 = iVar9 + iVar2;
  }
  lVar8 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  iVar2 = InitializeElementMatrix::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&local_48);
  lVar11 = 0;
  if (lVar8 < 1) {
    lVar8 = lVar11;
  }
  while (bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13) {
    lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar11)
    ;
    if (lVar1 != 0) {
      plVar6 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0)
      ;
      if (plVar6 != (long *)0x0) {
        plVar6 = (long *)(**(code **)(*plVar6 + 0xb8))(plVar6);
        (**(code **)(*plVar6 + 0x78))(plVar6);
      }
    }
    lVar11 = lVar11 + 0x10;
  }
  iVar3 = (*ef->_vptr_TPZElementMatrix[8])(ef);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x70))
            ((long *)CONCAT44(extraout_var,iVar3),(long)iVar9,(long)iVar2);
  iVar9 = (*ef->_vptr_TPZElementMatrix[10])(ef);
  TPZBlock::SetNBlocks((TPZBlock *)CONCAT44(extraout_var_00,iVar9),num_of_blocks);
  for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    pTVar5 = (TPZConnect *)
             (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa8))
                       (this,uVar10);
    pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
    iVar9 = TPZConnect::NDof(pTVar5,pTVar4);
    iVar2 = (*ef->_vptr_TPZElementMatrix[10])(ef);
    TPZBlock::Set((TPZBlock *)CONCAT44(extraout_var_01,iVar2),uVar10,iVar9,-1);
  }
  TPZManVector<long,_10>::Resize
            (&(ef->fConnect).super_TPZManVector<long,_10>,(long)(int)num_of_blocks);
  for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
    lVar8 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa0))
                      (this,uVar12 & 0xffffffff);
    (ef->fConnect).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar12] = lVar8;
  }
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            (&local_48,this);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_move_assign
            (&ef->fOneRestraints,&local_48);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&local_48);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeElementMatrix(TPZElementMatrix &ef)
{
    const int ncon = this->NConnects();
    ef.fMesh = Mesh();
    ef.fType = TPZElementMatrix::EF;
    int numeq = 0;
    int ic;
    
    for(ic=0; ic<ncon; ic++)
    {
        int64_t neqThisConn = Connect(ic).NDof(*Mesh());
        numeq += neqThisConn;
    }
    
    int64_t nref = this->fElementVec.size();
    int nstate = 0;
    //nstate=1;
    const int numloadcases = [this](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(this->Material()); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
    for (int64_t iref=0; iref<nref; iref++) {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (! msp) {
            continue;
        }
        TPZMaterial *mat = msp->Material();
        nstate += mat->NStateVariables();
    }
    
    const int numstate = nstate;
    ef.Matrix().Redim(numeq,numloadcases);
    ef.Block().SetNBlocks(ncon);
    
    int i;
    for(i=0; i<ncon; i++){
        unsigned int ndof = Connect(i).NDof(*Mesh());
#ifdef PZDEBUG
        TPZConnect &c = Connect(i);
        if (c.NShape()*c.NState() != ndof) {
            DebugStop();
        }
#endif
        ef.Block().Set(i,ndof);
    }
    ef.fConnect.Resize(ncon);
    for(i=0; i<ncon; i++){
        (ef.fConnect)[i] = ConnectIndex(i);
    }
    ef.fOneRestraints = GetShapeRestraints();
}